

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O2

int bcf_sr_regions_overlap(bcf_sr_regions_t *reg,char *seq,int start,int end)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined8 uStack_38;
  int iseq;
  
  uStack_38 = in_RAX;
  iVar1 = khash_str2int_get(reg->seq_hash,seq,&iseq);
  if (iVar1 < 0) {
    return -1;
  }
  iVar1 = reg->prev_seq;
  if (((iVar1 == -1) || (iseq != iVar1)) || (start < reg->prev_start)) {
    if (((iVar1 != -1) &&
        (reg->missed_reg_handler != (_func_void__bcf_sr_regions_t_ptr_void_ptr *)0x0)) &&
       (reg->iseq != -1)) {
      bcf_sr_regions_flush(reg);
    }
    bcf_sr_regions_seek(reg,seq);
    reg->start = -1;
    reg->end = -1;
    iVar1 = iseq;
    if (reg->prev_seq != iseq) {
      iVar1 = reg->iseq;
      iVar2 = iseq;
      goto LAB_001127ca;
    }
  }
  iVar2 = iVar1;
  if (reg->iseq != iVar1) {
    return -2;
  }
LAB_001127ca:
  reg->prev_seq = iVar1;
  reg->prev_start = start;
  while( true ) {
    if ((iVar2 != iVar1) || (start <= reg->end)) {
      return -(uint)(end < reg->start);
    }
    iVar1 = bcf_sr_regions_next(reg);
    if (iVar1 < 0) {
      return -2;
    }
    iVar1 = reg->iseq;
    if (iVar1 != iseq) break;
    iVar2 = iVar1;
    if ((reg->missed_reg_handler != (_func_void__bcf_sr_regions_t_ptr_void_ptr *)0x0) &&
       (reg->end < start)) {
      (*reg->missed_reg_handler)(reg,reg->missed_reg_data);
      iVar1 = reg->iseq;
      iVar2 = iseq;
    }
  }
  return -1;
}

Assistant:

int bcf_sr_regions_overlap(bcf_sr_regions_t *reg, const char *seq, int start, int end)
{
    int iseq;
    if ( khash_str2int_get(reg->seq_hash, seq, &iseq)<0 ) return -1;    // no such sequence

    if ( reg->prev_seq==-1 || iseq!=reg->prev_seq || reg->prev_start > start ) // new chromosome or after a seek
    {
        // flush regions left on previous chromosome
        if ( reg->missed_reg_handler && reg->prev_seq!=-1 && reg->iseq!=-1 )
            bcf_sr_regions_flush(reg);

        bcf_sr_regions_seek(reg, seq);
        reg->start = reg->end = -1;
    }
    if ( reg->prev_seq==iseq && reg->iseq!=iseq ) return -2;    // no more regions on this chromosome
    reg->prev_seq = reg->iseq;
    reg->prev_start = start;

    while ( iseq==reg->iseq && reg->end < start )
    {
        if ( bcf_sr_regions_next(reg) < 0 ) return -2;  // no more regions left
        if ( reg->iseq != iseq ) return -1; // does not overlap any regions
        if ( reg->missed_reg_handler && reg->end < start ) reg->missed_reg_handler(reg, reg->missed_reg_data);
    }
    if ( reg->start <= end ) return 0;    // region overlap
    return -1;  // no overlap
}